

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_pointer.cc
# Opt level: O2

void simple_map(void)

{
  char *pcVar1;
  slot_type *psVar2;
  uint uVar3;
  byte bVar4;
  char cVar5;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::interprocess::allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
  *this;
  MappedReference<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>_> pLVar6;
  ostream *poVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  __m128i match;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  segment_manager *local_88;
  in_place_interface local_80;
  undefined1 *local_60;
  managed_mapped_file mmap_file;
  char cVar15;
  char cVar17;
  char cVar18;
  char cVar19;
  
  local_80._vptr_in_place_interface =
       (_func_int **)CONCAT44(local_80._vptr_in_place_interface._4_4_,0x1a4);
  boost::interprocess::
  basic_managed_mapped_file<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
  ::basic_managed_mapped_file(&mmap_file,"map_iv.dat",1000000,0,&local_80);
  local_88 = mmap_file.
             super_basic_managed_memory_impl<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index,_16UL>
             .mp_header;
  local_80.alignment = 8;
  local_80.size = 0x38;
  local_80.type_name =
       "N5phmap13flat_hash_mapIKmZ10simple_mapvE7LatpLonSt4hashImESt8equal_toImEN5boost12interprocess9allocatorISt4pairIS1_S2_ENS8_15segment_managerIcNS8_15rbtree_best_fitINS8_12mutex_familyENS8_10offset_ptrIvlmLm0EEELm0EEENS8_10iset_indexEEEEEEE"
  ;
  local_80._vptr_in_place_interface = (_func_int **)&PTR_construct_n_0011cc68;
  local_60 = (undefined1 *)&local_88;
  this = (raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::interprocess::allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
          *)boost::interprocess::
            segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
            ::priv_generic_construct
                      (mmap_file.
                       super_basic_managed_memory_impl<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index,_16UL>
                       .mp_header,"node_store",1,true,true,&local_80);
  uVar12 = 0;
  do {
    if (uVar12 == 1000) {
      local_80._vptr_in_place_interface = (_func_int **)0xa;
      pLVar6 = phmap::priv::
               raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
               ::
               at<unsigned_long_const,phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>>
                         ((raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
                           *)this,(key_arg<const_unsigned_long> *)&local_80);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pLVar6->latp);
      poVar7 = std::operator<<(poVar7," ");
      local_88 = (segment_manager *)0xa;
      pLVar6 = phmap::priv::
               raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
               ::
               at<unsigned_long_const,phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>>
                         ((raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
                           *)this,(key_arg<const_unsigned_long> *)&local_88);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,pLVar6->lon);
      std::endl<char,std::char_traits<char>>(poVar7);
      boost::interprocess::
      basic_managed_mapped_file<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
      ::~basic_managed_mapped_file(&mmap_file);
      return;
    }
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar12;
    sVar11 = SUB168(auVar13 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar13 * ZEXT816(0xde5fb9d2630458e9),0);
    bVar4 = (byte)sVar11;
    if (this->ctrl_ != (ctrl_t *)0x0) {
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::interprocess::allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
      ::probe((probe_seq<16UL> *)&local_80,this,sVar11);
      auVar13 = ZEXT216(CONCAT11(bVar4,bVar4) & 0x7f7f);
      auVar13 = pshuflw(auVar13,auVar13,0);
      while( true ) {
        pcVar1 = this->ctrl_ + local_80.alignment;
        cVar5 = pcVar1[0xf];
        cVar15 = auVar13[0];
        auVar16[0] = -(cVar15 == *pcVar1);
        cVar17 = auVar13[1];
        auVar16[1] = -(cVar17 == pcVar1[1]);
        cVar18 = auVar13[2];
        auVar16[2] = -(cVar18 == pcVar1[2]);
        cVar19 = auVar13[3];
        auVar16[3] = -(cVar19 == pcVar1[3]);
        auVar16[4] = -(cVar15 == pcVar1[4]);
        auVar16[5] = -(cVar17 == pcVar1[5]);
        auVar16[6] = -(cVar18 == pcVar1[6]);
        auVar16[7] = -(cVar19 == pcVar1[7]);
        auVar16[8] = -(cVar15 == pcVar1[8]);
        auVar16[9] = -(cVar17 == pcVar1[9]);
        auVar16[10] = -(cVar18 == pcVar1[10]);
        auVar16[0xb] = -(cVar19 == pcVar1[0xb]);
        auVar16[0xc] = -(cVar15 == pcVar1[0xc]);
        auVar16[0xd] = -(cVar17 == pcVar1[0xd]);
        auVar16[0xe] = -(cVar18 == pcVar1[0xe]);
        auVar16[0xf] = -(cVar19 == cVar5);
        for (uVar9 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                                   (ushort)(auVar16[0xf] >> 7) << 0xf); uVar9 != 0;
            uVar9 = uVar9 - 1 & uVar9) {
          uVar3 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          uVar10 = uVar3 + local_80.alignment & (ulong)local_80._vptr_in_place_interface;
          if (this->slots_[uVar10].value.first == uVar12) {
            if (uVar10 == 0xffffffffffffffff) goto LAB_0010264d;
            goto LAB_00102685;
          }
        }
        auVar14[0] = -(*pcVar1 == -0x80);
        auVar14[1] = -(pcVar1[1] == -0x80);
        auVar14[2] = -(pcVar1[2] == -0x80);
        auVar14[3] = -(pcVar1[3] == -0x80);
        auVar14[4] = -(pcVar1[4] == -0x80);
        auVar14[5] = -(pcVar1[5] == -0x80);
        auVar14[6] = -(pcVar1[6] == -0x80);
        auVar14[7] = -(pcVar1[7] == -0x80);
        auVar14[8] = -(pcVar1[8] == -0x80);
        auVar14[9] = -(pcVar1[9] == -0x80);
        auVar14[10] = -(pcVar1[10] == -0x80);
        auVar14[0xb] = -(pcVar1[0xb] == -0x80);
        auVar14[0xc] = -(pcVar1[0xc] == -0x80);
        auVar14[0xd] = -(pcVar1[0xd] == -0x80);
        auVar14[0xe] = -(pcVar1[0xe] == -0x80);
        auVar14[0xf] = -(cVar5 == -0x80);
        if ((((((((((((((((auVar14 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar14 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar14 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar14 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar14 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar14 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar14 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar14 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar14 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar14 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar14 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar14 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar14 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar14 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar14 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar5 == -0x80)
        break;
        lVar8 = local_80.alignment + local_80.size;
        local_80.size = local_80.size + 0x10;
        local_80.alignment = lVar8 + 0x10U & (ulong)local_80._vptr_in_place_interface;
      }
    }
LAB_0010264d:
    sVar11 = phmap::priv::
             raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::interprocess::allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
             ::prepare_insert(this,sVar11);
    psVar2 = this->slots_;
    psVar2[sVar11].value.first = uVar12;
    *(undefined8 *)((long)psVar2 + sVar11 * 0x10 + 8) = 0xa0000000a;
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::interprocess::allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
    ::set_ctrl(this,sVar11,bVar4 & 0x7f);
LAB_00102685:
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

void simple_map() {
   struct LatpLon {
      int32_t latp;
      int32_t lon;
   };

   using nodestore_pair_t = std::pair<const uint64_t, LatpLon>;
   using map_t            = phmap::flat_hash_map<const uint64_t, LatpLon, std::hash<uint64_t>, std::equal_to<uint64_t>,
                                                 bi_alloc_t<nodestore_pair_t>>;

   auto mmap_file =
      boost::interprocess::managed_mapped_file(boost::interprocess::open_or_create, "map_iv.dat", 1000000);
   map_t* map = mmap_file.find_or_construct<map_t>("node_store")(mmap_file.get_segment_manager());

   for (unsigned int i = 0; i < 1000; ++i) {
      LatpLon p = {10, 10};
      map->emplace(i, p);
   }

   std::cout << map->at(10).latp << " " << map->at(10).lon << std::endl;
}